

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

void onmt::unicode::
     character_iterator<onmt::unicode::explode_utf8_with_marks(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,std::vector<int,std::allocator<int>>const*)::__0>
               (string *str,anon_class_32_4_4c2f144f *callback)

{
  code_point_t cVar1;
  code_point_t code_point;
  size_t char_size;
  char *c_str;
  size_t local_20;
  char *local_18;
  
  local_18 = (char *)std::__cxx11::string::c_str();
  while (*local_18 != '\0') {
    local_20 = 0;
    cVar1 = utf8_to_cp(local_18,&local_20);
    if (cVar1 == 0) {
      local_18 = local_18 + 1;
    }
    else {
      explode_utf8_with_marks::anon_class_32_4_4c2f144f::operator()
                ((anon_class_32_4_4c2f144f *)str,(char *)callback,(size_t)c_str,char_size._4_4_);
      local_18 = local_18 + local_20;
    }
  }
  return;
}

Assistant:

static inline void character_iterator(const std::string& str, const Callback& callback)
    {
      const char* c_str = str.c_str();
      while (*c_str)
      {
        size_t char_size = 0;
        code_point_t code_point = utf8_to_cp(c_str, &char_size);

        if (code_point == 0)  // Ignore invalid code points.
        {
          c_str++;
          continue;
        }

        callback(c_str, char_size, code_point);
        c_str += char_size;
      }
    }